

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOChrono.cpp
# Opt level: O1

void __thiscall adios2::profiling::IOChrono::Stop(IOChrono *this,string *process)

{
  iterator iVar1;
  undefined8 uVar2;
  ostream *poVar3;
  
  if (this->m_IsActive == true) {
    iVar1 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)this,process);
    if (iVar1.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>,_true>
        ._M_cur == (__node_type *)0x0) {
      uVar2 = std::__throw_out_of_range("_Map_base::at");
      __cxa_begin_catch(uVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Timer \"",7);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(process->_M_dataplus)._M_p,
                          process->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" doesn\'t exist.",0x10);
      std::endl<char,std::char_traits<char>>(poVar3);
      __cxa_end_catch();
      return;
    }
    Timer::Pause((Timer *)((long)iVar1.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>,_true>
                                 ._M_cur + 0x28));
  }
  return;
}

Assistant:

void IOChrono::Stop(const std::string process)
{
    if (m_IsActive)
    {
        try
        {
            m_Timers.at(process).Pause();
        }
        catch (...)
        {
            std::cout << "Timer \"" << process << "\" doesn't exist." << std::endl;
        }
    }
}